

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_line_element.hpp
# Opt level: O2

void __thiscall TextLineElement::~TextLineElement(TextLineElement *this)

{
  LineElement::~LineElement(&this->super_LineElement);
  operator_delete(this,0x28);
  return;
}

Assistant:

~TextLineElement() {}